

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O3

void dec_get_part_info(com_core_t *core,com_part_info_t *sub_info)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  
  if ((uint)core->pb_part < 8) {
    iVar8 = core->cu_pix_x;
    iVar1 = core->cu_pix_y;
    iVar13 = core->cu_width;
    iVar6 = core->cu_height;
    uVar5 = iVar13 >> 2;
    uVar4 = iVar6 >> 2;
    switch(core->pb_part) {
    case 0:
      sub_info->num_sub_part = '\x01';
      sub_info->sub_x[0] = iVar8;
      sub_info->sub_y[0] = iVar1;
      sub_info->sub_w[0] = iVar13;
      sub_info->sub_h[0] = iVar6;
      break;
    case 1:
      sub_info->num_sub_part = '\x02';
      lVar3 = 0;
      bVar7 = true;
      do {
        bVar2 = bVar7;
        uVar5 = uVar4;
        if (bVar2) {
          uVar5 = 0;
        }
        sub_info->sub_x[lVar3] = iVar8;
        sub_info->sub_y[lVar3] = uVar5 + iVar1;
        sub_info->sub_w[lVar3] = iVar13;
        sub_info->sub_h[lVar3] = ((uint)(byte)~bVar2 * 2 + 1) * uVar4;
        lVar3 = 1;
        bVar7 = false;
      } while (bVar2);
      break;
    case 2:
      sub_info->num_sub_part = '\x02';
      lVar3 = 0;
      iVar6 = 1;
      do {
        sub_info->sub_x[lVar3] = iVar8;
        sub_info->sub_y[lVar3] = ((byte)~(byte)iVar6 & 1) * uVar4 * 3 + iVar1;
        sub_info->sub_w[lVar3] = iVar13;
        sub_info->sub_h[lVar3] = (iVar6 * 2 + 1) * uVar4;
        lVar3 = 1;
        bVar7 = iVar6 != 0;
        iVar6 = 0;
      } while (bVar7);
      break;
    case 3:
      sub_info->num_sub_part = '\x02';
      lVar3 = 0;
      bVar7 = true;
      do {
        bVar2 = bVar7;
        uVar4 = uVar5;
        if (bVar2) {
          uVar4 = 0;
        }
        sub_info->sub_x[lVar3] = uVar4 + iVar8;
        sub_info->sub_y[lVar3] = iVar1;
        sub_info->sub_w[lVar3] = ((uint)(byte)~bVar2 * 2 + 1) * uVar5;
        sub_info->sub_h[lVar3] = iVar6;
        lVar3 = 1;
        bVar7 = false;
      } while (bVar2);
      break;
    case 4:
      sub_info->num_sub_part = '\x02';
      lVar3 = 0;
      iVar13 = 1;
      do {
        sub_info->sub_x[lVar3] = ((byte)~(byte)iVar13 & 1) * uVar5 * 3 + iVar8;
        sub_info->sub_y[lVar3] = iVar1;
        sub_info->sub_w[lVar3] = (iVar13 * 2 + 1) * uVar5;
        sub_info->sub_h[lVar3] = iVar6;
        lVar3 = 1;
        bVar7 = iVar13 != 0;
        iVar13 = 0;
      } while (bVar7);
      break;
    case 5:
      sub_info->num_sub_part = '\x04';
      auVar11._4_4_ = uVar4;
      auVar11._0_4_ = uVar4;
      auVar11._8_4_ = uVar4;
      auVar11._12_4_ = uVar4;
      sub_info->sub_x[0] = iVar8;
      sub_info->sub_x[1] = (int)(((ulong)uVar5 << 0x21) >> 0x20) + iVar8;
      sub_info->sub_x[2] = iVar8;
      sub_info->sub_x[3] = uVar5 * 2 + iVar8;
      auVar10._0_12_ = ZEXT412(2) << 0x40;
      auVar10._12_4_ = 2;
      sub_info->sub_y[0] = iVar1;
      sub_info->sub_y[1] = iVar1;
      sub_info->sub_y[2] = (int)((auVar11._8_8_ & 0xffffffff) * 2) + iVar1;
      sub_info->sub_y[3] = (int)((auVar10._8_8_ & 0xffffffff) * (ulong)uVar4) + iVar1;
      sub_info->sub_w[0] = uVar5 * 2;
      sub_info->sub_w[1] = uVar5 * 2;
      sub_info->sub_w[2] = uVar5 * 2;
      sub_info->sub_w[3] = uVar5 * 2;
      sub_info->sub_h[0] = uVar4 * 2;
      sub_info->sub_h[1] = uVar4 * 2;
      sub_info->sub_h[2] = uVar4 * 2;
      sub_info->sub_h[3] = uVar4 * 2;
      break;
    case 6:
      sub_info->num_sub_part = '\x04';
      sub_info->sub_x[0] = iVar8;
      sub_info->sub_x[1] = iVar8;
      sub_info->sub_x[2] = iVar8;
      sub_info->sub_x[3] = iVar8;
      iVar8 = DAT_00163a90._4_4_;
      auVar12._4_4_ = iVar8;
      auVar12._0_4_ = iVar8;
      auVar12._8_4_ = DAT_00163a90._12_4_;
      auVar12._12_4_ = DAT_00163a90._12_4_;
      uVar9 = DAT_00163a90._8_8_;
      sub_info->sub_y[0] = (int)DAT_00163a90 * uVar4 + iVar1;
      sub_info->sub_y[1] = iVar8 * uVar4 + iVar1;
      sub_info->sub_y[2] = (int)((uVar9 & 0xffffffff) * (ulong)uVar4) + iVar1;
      sub_info->sub_y[3] = (int)((auVar12._8_8_ & 0xffffffff) * (ulong)uVar4) + iVar1;
      sub_info->sub_w[0] = iVar13;
      sub_info->sub_w[1] = iVar13;
      sub_info->sub_w[2] = iVar13;
      sub_info->sub_w[3] = iVar13;
      sub_info->sub_h[0] = uVar4;
      sub_info->sub_h[1] = uVar4;
      sub_info->sub_h[2] = uVar4;
      sub_info->sub_h[3] = uVar4;
      break;
    case 7:
      sub_info->num_sub_part = '\x04';
      iVar13 = DAT_00163a90._4_4_;
      auVar14._4_4_ = iVar13;
      auVar14._0_4_ = iVar13;
      auVar14._8_4_ = DAT_00163a90._12_4_;
      auVar14._12_4_ = DAT_00163a90._12_4_;
      uVar9 = DAT_00163a90._8_8_;
      sub_info->sub_x[0] = (int)DAT_00163a90 * uVar5 + iVar8;
      sub_info->sub_x[1] = iVar13 * uVar5 + iVar8;
      sub_info->sub_x[2] = (int)((uVar9 & 0xffffffff) * (ulong)uVar5) + iVar8;
      sub_info->sub_x[3] = (int)((auVar14._8_8_ & 0xffffffff) * (ulong)uVar5) + iVar8;
      sub_info->sub_y[0] = iVar1;
      sub_info->sub_y[1] = iVar1;
      sub_info->sub_y[2] = iVar1;
      sub_info->sub_y[3] = iVar1;
      sub_info->sub_w[0] = uVar5;
      sub_info->sub_w[1] = uVar5;
      sub_info->sub_w[2] = uVar5;
      sub_info->sub_w[3] = uVar5;
      sub_info->sub_h[0] = iVar6;
      sub_info->sub_h[1] = iVar6;
      sub_info->sub_h[2] = iVar6;
      sub_info->sub_h[3] = iVar6;
    }
  }
  return;
}

Assistant:

void dec_get_part_info(com_core_t *core, com_part_info_t* sub_info)
{
    int i;
    int x = core->cu_pix_x;
    int y = core->cu_pix_y;
    int w = core->cu_width;
    int h = core->cu_height;
    int part_size = core->pb_part;
    int qw = w >> MIN_CU_LOG2;
    int qh = h >> MIN_CU_LOG2;

    switch (part_size)
    {
    case SIZE_2Nx2N:
        sub_info->num_sub_part = 1;
        sub_info->sub_x[0] = x;
        sub_info->sub_y[0] = y;
        sub_info->sub_w[0] = w;
        sub_info->sub_h[0] = h;
        break;
    case SIZE_2NxhN:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * i + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh;
        }
        break;
    case SIZE_2NxnU:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * (i == 0 ? 0 : 1) + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh * (i == 0 ? 1 : 3);
        }
        break;
    case SIZE_2NxnD:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = x;
            sub_info->sub_y[i] = qh * (i == 0 ? 0 : 3) + y;
            sub_info->sub_w[i] = w;
            sub_info->sub_h[i] = qh * (i == 0 ? 3 : 1);
        }
        break;
    case SIZE_hNx2N:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * i + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw;
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_nLx2N:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 ? 0 : 1) + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw * (i == 0 ? 1 : 3);
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_nRx2N:
        sub_info->num_sub_part = 2;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 ? 0 : 3) + x;
            sub_info->sub_y[i] = y;
            sub_info->sub_w[i] = qw * (i == 0 ? 3 : 1);
            sub_info->sub_h[i] = h;
        }
        break;
    case SIZE_NxN:
        sub_info->num_sub_part = 4;
        for (i = 0; i < sub_info->num_sub_part; i++)
        {
            sub_info->sub_x[i] = qw * (i == 0 || i == 2 ? 0 : 2) + x;
            sub_info->sub_y[i] = qh * (i == 0 || i == 1 ? 0 : 2) + y;
            sub_info->sub_w[i] = qw * 2;
            sub_info->sub_h[i] = qh * 2;
        }
        break;
    default:
        uavs3d_assert(0);
    }
}